

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O1

uint64_t __thiscall
XPMP2::SoundSystemFMOD::Play(SoundSystemFMOD *this,string *sndName,float vol,Aircraft *ac)

{
  undefined1 auVar1 [16];
  int iVar2;
  FMOD_RESULT FVar3;
  FMOD_RESULT extraout_EAX;
  FMOD_RESULT extraout_EAX_00;
  FMOD_RESULT extraout_EAX_01;
  mapped_type *pmVar4;
  SoundFile *pSVar5;
  uint64_t uVar6;
  runtime_error *prVar7;
  FmodError *pFVar8;
  pair<unsigned_long,_XPMP2::SoundChannel_*> pVar9;
  FMOD_CHANNEL *pFmodChn;
  string local_110;
  string local_f0;
  FMOD_CHANNEL *local_d0;
  string local_c8;
  SoundSystemFMOD *local_a8;
  float local_9c;
  FmodError local_98;
  string *local_38;
  
  local_d0 = (FMOD_CHANNEL *)0x0;
  local_a8 = this;
  local_9c = vol;
  local_38 = sndName;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
           ::at(&(this->super_SoundSystem).mapSounds,sndName);
  iVar2 = (*((pmVar4->_M_t).
             super___uniq_ptr_impl<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>._M_t.
             super__Tuple_impl<0UL,_XPMP2::SoundFile_*,_std::default_delete<XPMP2::SoundFile>_>.
             super__Head_base<0UL,_XPMP2::SoundFile_*,_false>._M_head_impl)->_vptr_SoundFile[2])();
  if ((char)iVar2 == '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Sound not yet ready");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pSVar5 = (pmVar4->_M_t).
           super___uniq_ptr_impl<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>._M_t.
           super__Tuple_impl<0UL,_XPMP2::SoundFile_*,_std::default_delete<XPMP2::SoundFile>_>.
           super__Head_base<0UL,_XPMP2::SoundFile_*,_false>._M_head_impl;
  if (pSVar5 == (SoundFile *)0x0) {
    pSVar5 = (SoundFile *)0x0;
  }
  else {
    pSVar5 = (SoundFile *)__dynamic_cast(pSVar5,&SoundFile::typeinfo,&SoundFMOD::typeinfo,0);
  }
  if (pSVar5 == (SoundFile *)0x0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Sound has not been loaded for FMOD system");
  }
  else {
    gFmodRes = FMOD_System_PlaySound
                         (local_a8->pFmodSystem,pSVar5[1]._vptr_SoundFile,local_a8->pChnGrp,1,
                          &local_d0);
    if (gFmodRes != FMOD_OK) {
      pFVar8 = (FmodError *)__cxa_allocate_exception(0x60);
      local_98._0_8_ = (long)&local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "FMOD_System_PlaySound(pFmodSystem, pSndFmod->GetSnd(), pChnGrp, true, &pFmodChn)",
                 "");
      FVar3 = gFmodRes;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,"");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Play","");
      FmodError::FmodError(pFVar8,(string *)&local_98,FVar3,&local_f0,0x126,&local_110);
      __cxa_throw(pFVar8,&FmodError::typeinfo,FmodError::~FmodError);
    }
    if (local_d0 != (FMOD_CHANNEL *)0x0) {
      pVar9 = SoundSystem::AddChn(&local_a8->super_SoundSystem,pSVar5,local_9c,local_d0);
      uVar6 = pVar9.first;
      if (pVar9.second == (SoundChannel *)0x0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"pChn is NULL");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      gFmodRes = FMOD_Channel_SetUserData(local_d0,uVar6);
      if (gFmodRes == FMOD_OK) {
        gFmodRes = FMOD_Channel_SetCallback(local_d0,ChnCB);
        if (gFmodRes == FMOD_OK) {
          FVar3 = FMOD_Channel_Set3DMinMaxDistance((float)ac->sndMinDist,0x461c4000,local_d0);
          gFmodRes = FVar3;
          if (FVar3 != FMOD_OK) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,
                       "FMOD_Channel_Set3DMinMaxDistance(pFmodChn, (float)ac.sndMinDist, FMOD_3D_MAX_DIST)"
                       ,"");
            FVar3 = gFmodRes;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                       ,"");
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Play","");
            FmodError::FmodError(&local_98,&local_f0,FVar3,&local_110,0x131,&local_c8);
            FmodError::LogErr(&local_98);
            local_98._0_8_ = &PTR__FmodError_002e0a18;
            if (local_98.sFunc._M_dataplus._M_p != (pointer)((long)&local_98 + 0x50U)) {
              operator_delete(local_98.sFunc._M_dataplus._M_p,
                              local_98.sFunc.field_2._M_allocated_capacity + 1);
            }
            if (local_98.sFile._M_dataplus._M_p != (pointer)((long)&local_98 + 0x28U)) {
              operator_delete(local_98.sFile._M_dataplus._M_p,
                              local_98.sFile.field_2._M_allocated_capacity + 1);
            }
            FVar3 = std::runtime_error::~runtime_error(&local_98.super_runtime_error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
              FVar3 = extraout_EAX;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
              FVar3 = extraout_EAX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
              FVar3 = extraout_EAX_01;
            }
          }
          auVar1._4_4_ = -(uint)NAN(pSVar5->conePitch);
          auVar1._0_4_ = -(uint)NAN(pSVar5->coneDir);
          auVar1._8_4_ = -(uint)NAN(pSVar5->coneInAngle);
          auVar1._12_4_ = -(uint)NAN(pSVar5->coneOutAngle);
          iVar2 = movmskps(FVar3,auVar1);
          if ((iVar2 == 0) && (!NAN(pSVar5->coneOutVol))) {
            gFmodRes = FMOD_Channel_Set3DConeSettings
                                 (pSVar5->coneInAngle,pSVar5->coneOutAngle,local_d0);
            if (gFmodRes != FMOD_OK) {
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,
                         "FMOD_Channel_Set3DConeSettings(pFmodChn, pSndFmod->coneInAngle, pSndFmod->coneOutAngle, pSndFmod->coneOutVol)"
                         ,"");
              FVar3 = gFmodRes;
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                         ,"");
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Play","");
              FmodError::FmodError(&local_98,&local_f0,FVar3,&local_110,0x136,&local_c8);
              FmodError::LogErr(&local_98);
              local_98._0_8_ = &PTR__FmodError_002e0a18;
              if (local_98.sFunc._M_dataplus._M_p != (pointer)((long)&local_98 + 0x50U)) {
                operator_delete(local_98.sFunc._M_dataplus._M_p,
                                local_98.sFunc.field_2._M_allocated_capacity + 1);
              }
              if (local_98.sFile._M_dataplus._M_p != (pointer)((long)&local_98 + 0x28U)) {
                operator_delete(local_98.sFile._M_dataplus._M_p,
                                local_98.sFile.field_2._M_allocated_capacity + 1);
              }
              std::runtime_error::~runtime_error(&local_98.super_runtime_error);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          (*(local_a8->super_SoundSystem)._vptr_SoundSystem[6])(local_a8,uVar6,ac,1);
          gFmodRes = FMOD_Channel_SetVolume(local_9c,local_d0);
          if (gFmodRes != FMOD_OK) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"FMOD_Channel_SetVolume(pFmodChn, vol)","");
            FVar3 = gFmodRes;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                       ,"");
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Play","");
            FmodError::FmodError(&local_98,&local_f0,FVar3,&local_110,0x139,&local_c8);
            FmodError::LogErr(&local_98);
            local_98._0_8_ = &PTR__FmodError_002e0a18;
            if (local_98.sFunc._M_dataplus._M_p != (pointer)((long)&local_98 + 0x50U)) {
              operator_delete(local_98.sFunc._M_dataplus._M_p,
                              local_98.sFunc.field_2._M_allocated_capacity + 1);
            }
            if (local_98.sFile._M_dataplus._M_p != (pointer)((long)&local_98 + 0x28U)) {
              operator_delete(local_98.sFile._M_dataplus._M_p,
                              local_98.sFile.field_2._M_allocated_capacity + 1);
            }
            std::runtime_error::~runtime_error(&local_98.super_runtime_error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          gFmodRes = FMOD_Channel_SetMute(local_d0,ac->bChnMuted);
          if (gFmodRes != FMOD_OK) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"FMOD_Channel_SetMute(pFmodChn, ac.SoundIsMuted())","");
            FVar3 = gFmodRes;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                       ,"");
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Play","");
            FmodError::FmodError(&local_98,&local_f0,FVar3,&local_110,0x13a,&local_c8);
            FmodError::LogErr(&local_98);
            local_98._0_8_ = &PTR__FmodError_002e0a18;
            if (local_98.sFunc._M_dataplus._M_p != (pointer)((long)&local_98 + 0x50U)) {
              operator_delete(local_98.sFunc._M_dataplus._M_p,
                              local_98.sFunc.field_2._M_allocated_capacity + 1);
            }
            if (local_98.sFile._M_dataplus._M_p != (pointer)((long)&local_98 + 0x28U)) {
              operator_delete(local_98.sFile._M_dataplus._M_p,
                              local_98.sFile.field_2._M_allocated_capacity + 1);
            }
            std::runtime_error::~runtime_error(&local_98.super_runtime_error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_a8->bLowPass == true) {
            gFmodRes = FMOD_Channel_SetLowPassGain(0x3e4ccccd,local_d0);
            if (gFmodRes != FMOD_OK) {
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,
                         "FMOD_Channel_SetLowPassGain(pFmodChn, FMOD_LOW_PASS_GAIN)","");
              FVar3 = gFmodRes;
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                         ,"");
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Play","");
              FmodError::FmodError(&local_98,&local_f0,FVar3,&local_110,0x13c,&local_c8);
              FmodError::LogErr(&local_98);
              local_98._0_8_ = &PTR__FmodError_002e0a18;
              if (local_98.sFunc._M_dataplus._M_p != (pointer)((long)&local_98 + 0x50U)) {
                operator_delete(local_98.sFunc._M_dataplus._M_p,
                                local_98.sFunc.field_2._M_allocated_capacity + 1);
              }
              if (local_98.sFile._M_dataplus._M_p != (pointer)((long)&local_98 + 0x28U)) {
                operator_delete(local_98.sFile._M_dataplus._M_p,
                                local_98.sFile.field_2._M_allocated_capacity + 1);
              }
              std::runtime_error::~runtime_error(&local_98.super_runtime_error);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          return uVar6;
        }
        pFVar8 = (FmodError *)__cxa_allocate_exception(0x60);
        local_98._0_8_ = (long)&local_98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"FMOD_Channel_SetCallback(pFmodChn, ChnCB)","");
        FVar3 = gFmodRes;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                   ,"");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Play","");
        FmodError::FmodError(pFVar8,(string *)&local_98,FVar3,&local_f0,0x12e,&local_110);
        __cxa_throw(pFVar8,&FmodError::typeinfo,FmodError::~FmodError);
      }
      pFVar8 = (FmodError *)__cxa_allocate_exception(0x60);
      local_98._0_8_ = (long)&local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"FMOD_Channel_SetUserData(pFmodChn, (void*)sndId)","");
      FVar3 = gFmodRes;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,"");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Play","");
      FmodError::FmodError(pFVar8,(string *)&local_98,FVar3,&local_f0,0x12d,&local_110);
      __cxa_throw(pFVar8,&FmodError::typeinfo,FmodError::~FmodError);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"FMOD_System_PlaySound returned NULL channel");
  }
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t SoundSystemFMOD::Play (const std::string& sndName, float vol, const Aircraft& ac)
{
    FMOD_CHANNEL* pFmodChn = nullptr;
    uint64_t sndId = 0;

    // Find the sound a check if it is ready
    try {
        // find the sound, may throw if not found, return if sound isn't ready yet
        SoundFilePtr& pSnd = mapSounds.at(sndName);
        if (!pSnd->isReady()) throw std::runtime_error("Sound not yet ready");
        SoundFMOD* pSndFmod = dynamic_cast<SoundFMOD*>(pSnd.get());
        if (!pSndFmod) throw std::runtime_error("Sound has not been loaded for FMOD system");

        // Start playing the sound, but in a paused state to avoid crackling
        FMOD_TEST(FMOD_System_PlaySound(pFmodSystem, pSndFmod->GetSnd(), pChnGrp, true, &pFmodChn));
        if (!pFmodChn) throw std::runtime_error("FMOD_System_PlaySound returned NULL channel");
        
        // We must keep track of the sounds we produce so we can clean up after us
        SoundChannel* pChn = nullptr;
        std::tie(sndId, pChn) = AddChn(pSndFmod, vol, pFmodChn);
        if (!pChn) throw std::runtime_error("pChn is NULL");
        FMOD_TEST(FMOD_Channel_SetUserData(pFmodChn, (void*)sndId));// save internal sound id for later bookkeeping
        FMOD_TEST(FMOD_Channel_SetCallback(pFmodChn, ChnCB));       // set callback, this is essential for internal cleanup!
        
        // Set a few more parameters to the sound
        FMOD_LOG(FMOD_Channel_Set3DMinMaxDistance(pFmodChn, (float)ac.sndMinDist, FMOD_3D_MAX_DIST));
        if (pSndFmod->hasConeInfo()) {
            FMOD_LOG(FMOD_Channel_Set3DConeSettings(pFmodChn,
                                                    pSndFmod->coneInAngle,
                                                    pSndFmod->coneOutAngle,
                                                    pSndFmod->coneOutVol));
        }
        SetPosOrientation(sndId, ac, true);
        FMOD_LOG(FMOD_Channel_SetVolume(pFmodChn, vol));
        FMOD_LOG(FMOD_Channel_SetMute(pFmodChn, ac.SoundIsMuted()));
        if (bLowPass) {
            FMOD_LOG(FMOD_Channel_SetLowPassGain(pFmodChn, FMOD_LOW_PASS_GAIN));
        }

        // Success
        return sndId;
    }
    FMOD_CATCH
    catch (const std::runtime_error& e) {
        LOG_MSG(logERR, "Could not play sound '%s': %s",
                sndName.c_str(), e.what());
    }
    
    // So there was an error...we better remove the sound
    if (sndId)
        RemoveChn(sndId);
    
    return 0;
}